

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

string * __thiscall
Catch::Matchers::Floating::WithinUlpsMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,WithinUlpsMatcher *this)

{
  ostream *poVar1;
  float fVar2;
  double dVar3;
  stringstream local_1a0 [8];
  stringstream ret;
  ostream local_190 [376];
  WithinUlpsMatcher *local_18;
  WithinUlpsMatcher *this_local;
  
  local_18 = this;
  this_local = (WithinUlpsMatcher *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"is within ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ulps);
  std::operator<<(poVar1," ULPs of ");
  if (this->m_type == Float) {
    anon_unknown_1::write<float>((ostream *)local_190,(float)this->m_target);
    std::operator<<(local_190,'f');
  }
  else {
    anon_unknown_1::write<double>((ostream *)local_190,this->m_target);
  }
  std::operator<<(local_190," ([");
  if (this->m_type == Double) {
    dVar3 = anon_unknown_1::step<double>(this->m_target,-INFINITY,this->m_ulps);
    anon_unknown_1::write<double>((ostream *)local_190,dVar3);
    std::operator<<(local_190,", ");
    dVar3 = anon_unknown_1::step<double>(this->m_target,INFINITY,this->m_ulps);
    anon_unknown_1::write<double>((ostream *)local_190,dVar3);
  }
  else {
    fVar2 = anon_unknown_1::step<float>((float)this->m_target,-INFINITY,this->m_ulps);
    anon_unknown_1::write<float>((ostream *)local_190,fVar2);
    std::operator<<(local_190,", ");
    fVar2 = anon_unknown_1::step<float>((float)this->m_target,INFINITY,this->m_ulps);
    anon_unknown_1::write<float>((ostream *)local_190,fVar2);
  }
  std::operator<<(local_190,"])");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string WithinUlpsMatcher::describe() const {
        std::stringstream ret;

        ret << "is within " << m_ulps << " ULPs of ";

        if (m_type == FloatingPointKind::Float) {
            write(ret, static_cast<float>(m_target));
            ret << 'f';
        } else {
            write(ret, m_target);
        }

        ret << " ([";
        if (m_type == FloatingPointKind::Double) {
            write(ret, step(m_target, static_cast<double>(-INFINITY), m_ulps));
            ret << ", ";
            write(ret, step(m_target, static_cast<double>( INFINITY), m_ulps));
        } else {
            // We have to cast INFINITY to float because of MinGW, see #1782
            write(ret, step(static_cast<float>(m_target), static_cast<float>(-INFINITY), m_ulps));
            ret << ", ";
            write(ret, step(static_cast<float>(m_target), static_cast<float>( INFINITY), m_ulps));
        }
        ret << "])";

        return ret.str();
    }